

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokens.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Tokens::createTokenOrphan
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Tokens *this,Parameters *parameters)

{
  Client *client;
  allocator<char> local_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  char local_78 [8];
  undefined8 uStack_70;
  Path local_68;
  Url local_48;
  
  client = *(Client **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"create-orphan",&local_89);
  local_68.value_._M_dataplus._M_p = (pointer)&local_68.value_.field_2;
  if (local_88 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78) {
    local_68.value_.field_2._8_8_ = uStack_70;
  }
  else {
    local_68.value_._M_dataplus._M_p = (pointer)local_88;
  }
  local_68.value_._M_string_length = local_80;
  local_80 = 0;
  local_78[0] = '\0';
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_78;
  getUrl(&local_48,this,&local_68);
  HttpConsumer::post(__return_storage_ptr__,client,&local_48,parameters);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Tokens::createTokenOrphan(const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{"create-orphan"}), parameters);
}